

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_zone.cpp
# Opt level: O1

void __thiscall
sf2cute::SFInstrumentZone::SFInstrumentZone(SFInstrumentZone *this,SFInstrumentZone *origin)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  SFZone::SFZone(&this->super_SFZone,&origin->super_SFZone);
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFInstrumentZone_0011e790;
  (this->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (origin->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (origin->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sample_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  this->parent_instrument_ = (SFInstrument *)0x0;
  return;
}

Assistant:

SFInstrumentZone::SFInstrumentZone(const SFInstrumentZone & origin) :
    SFZone(origin),
    sample_(origin.sample_),
    parent_instrument_(nullptr) {
}